

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

string * __thiscall
llvm::sys::path::convert_to_slash_abi_cxx11_
          (string *__return_storage_ptr__,path *this,StringRef path,Style style)

{
  Style SVar1;
  char local_3a [2];
  char *local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined1 local_25;
  Style local_24;
  undefined1 auStack_20 [4];
  Style style_local;
  StringRef path_local;
  string *s;
  
  path_local.Data = path.Data;
  local_24 = (Style)path.Length;
  _auStack_20 = this;
  path_local.Length = (size_t)__return_storage_ptr__;
  SVar1 = anon_unknown.dwarf_21af95::real_style(local_24);
  if (SVar1 == windows) {
    local_25 = 0;
    StringRef::str_abi_cxx11_(__return_storage_ptr__,(StringRef *)auStack_20);
    local_30._M_current = (char *)std::__cxx11::string::begin();
    local_38 = (char *)std::__cxx11::string::end();
    local_3a[1] = 0x5c;
    local_3a[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_30,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_38,local_3a + 1,local_3a);
  }
  else {
    StringRef::operator_cast_to_string(__return_storage_ptr__,(StringRef *)auStack_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convert_to_slash(StringRef path, Style style) {
  if (real_style(style) != Style::windows)
    return path;

  std::string s = path.str();
  std::replace(s.begin(), s.end(), '\\', '/');
  return s;
}